

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall UnitTest_parser21::Run(UnitTest_parser21 *this)

{
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_RDI;
  ParseException *anon_var_0;
  allocator *s;
  allocator local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  UnitTestBase *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [48];
  
  s = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"t = {} t.a = ",s);
  anon_unknown.dwarf_4b09::Parse((string *)s);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(in_RDI);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"\'{ Parse(\"t = {} t.a = \"); }\' has no luna::ParseException",&local_69);
  UnitTestBase::Error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

TEST_CASE(parser21)
{
    EXPECT_EXCEPTION(luna::ParseException,
                     {
                         Parse("t = {} t.a = ");
                     });
}